

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_artifact_set_values(parser *p)

{
  int16_t *value_00;
  errr eVar1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  parser_error pVar5;
  wchar_t index;
  wchar_t value;
  int local_48;
  int local_44;
  long local_40;
  char *local_38;
  
  pvVar3 = parser_priv(p);
  local_40 = *(long *)((long)pvVar3 + 0x20);
  if (local_40 == 0) {
    __assert_fail("e",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                  ,0xd5a,"enum parser_error parse_artifact_set_values(struct parser *)");
  }
  pcVar4 = parser_getstr(p,"values");
  local_38 = string_make(pcVar4);
  pcVar4 = strtok(local_38," |");
  if (pcVar4 == (char *)0x0) {
    pVar5 = PARSE_ERROR_NONE;
  }
  else {
    value_00 = (int16_t *)(local_40 + 0x12);
    do {
      local_44 = 0;
      local_48 = 0;
      eVar1 = grab_int_value(value_00,obj_mods,pcVar4);
      eVar2 = grab_index_and_int(&local_44,&local_48,element_names,"RES_",pcVar4);
      if (eVar2 == 0) {
        *(short *)(local_40 + 0x34 + (long)local_48 * 4) = 100 - (short)local_44;
      }
      else if (eVar1 != 0) {
        pVar5 = PARSE_ERROR_INVALID_VALUE;
        break;
      }
      pVar5 = PARSE_ERROR_NONE;
      pcVar4 = strtok((char *)0x0," |");
    } while (pcVar4 != (char *)0x0);
  }
  mem_free(local_38);
  return pVar5;
}

Assistant:

static enum parser_error parse_artifact_set_values(struct parser *p) {
	struct artifact_set *set = parser_priv(p);
	struct set_item *e = set->set_item;
	char *s;
	char *t;
	assert(set);
	assert(e);

	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		bool found = false;
		int value = 0;
		int index = 0;
		if (!grab_int_value(e->modifiers, obj_mods, t))
			found = true;
		if (!grab_index_and_int(&value, &index, element_names, "RES_", t)) {
			found = true;
			e->el_info[index].res_level = RES_LEVEL_BASE - value;
		}
		if (!found)
			break;

		t = strtok(NULL, " |");
	}

	mem_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}